

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error tex_type<28>(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  unsigned_long *puVar2;
  undefined8 in_RCX;
  optional<unsigned_long> oVar3;
  token local_70;
  string_view local_48;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> result;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = in_RCX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"");
  oVar3 = find_in_table((token *)op,tex_type<28>::types,local_48);
  local_38._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
  if (bVar1) {
    context::tokenize(&local_70,(context *)token);
    memcpy(op,&local_70,0x24);
    puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_38);
    opcode::add_bits((opcode *)
                     result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._8_8_,*puVar2 << 0x1c);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  else {
    fail((token *)ctx,(char *)op,
         "expected 1D, ARRAY_1D, 2D, ARRAY_2D, 3D, ARRAY_3D, CUBE, or ARRAY_CUBE");
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(tex_type)
{
    static const char* types[]{
        "1D", "ARRAY_1D", "2D", "ARRAY_2D", "3D", "ARRAY_3D", "CUBE", "ARRAY_CUBE",
    };
    const std::optional<uint64_t> result = find_in_table(token, types, "");
    if (!result) {
        return fail(token,
                    "expected 1D, ARRAY_1D, 2D, ARRAY_2D, 3D, ARRAY_3D, CUBE, or ARRAY_CUBE");
    }
    token = ctx.tokenize();
    op.add_bits(*result << address);
    return {};
}